

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

void __thiscall tinygltf::Animation::Animation(Animation *this,Animation *param_1)

{
  pointer pAVar1;
  pointer pAVar2;
  
  std::__cxx11::string::string((string *)this,(string *)param_1);
  pAVar1 = (param_1->channels).
           super__Vector_base<tinygltf::AnimationChannel,_std::allocator<tinygltf::AnimationChannel>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->channels).
  super__Vector_base<tinygltf::AnimationChannel,_std::allocator<tinygltf::AnimationChannel>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (param_1->channels).
       super__Vector_base<tinygltf::AnimationChannel,_std::allocator<tinygltf::AnimationChannel>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->channels).
  super__Vector_base<tinygltf::AnimationChannel,_std::allocator<tinygltf::AnimationChannel>_>.
  _M_impl.super__Vector_impl_data._M_finish = pAVar1;
  (this->channels).
  super__Vector_base<tinygltf::AnimationChannel,_std::allocator<tinygltf::AnimationChannel>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->channels).
       super__Vector_base<tinygltf::AnimationChannel,_std::allocator<tinygltf::AnimationChannel>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->channels).
  super__Vector_base<tinygltf::AnimationChannel,_std::allocator<tinygltf::AnimationChannel>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->channels).
  super__Vector_base<tinygltf::AnimationChannel,_std::allocator<tinygltf::AnimationChannel>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->channels).
  super__Vector_base<tinygltf::AnimationChannel,_std::allocator<tinygltf::AnimationChannel>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pAVar2 = (param_1->samplers).
           super__Vector_base<tinygltf::AnimationSampler,_std::allocator<tinygltf::AnimationSampler>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->samplers).
  super__Vector_base<tinygltf::AnimationSampler,_std::allocator<tinygltf::AnimationSampler>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (param_1->samplers).
       super__Vector_base<tinygltf::AnimationSampler,_std::allocator<tinygltf::AnimationSampler>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->samplers).
  super__Vector_base<tinygltf::AnimationSampler,_std::allocator<tinygltf::AnimationSampler>_>.
  _M_impl.super__Vector_impl_data._M_finish = pAVar2;
  (this->samplers).
  super__Vector_base<tinygltf::AnimationSampler,_std::allocator<tinygltf::AnimationSampler>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->samplers).
       super__Vector_base<tinygltf::AnimationSampler,_std::allocator<tinygltf::AnimationSampler>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->samplers).
  super__Vector_base<tinygltf::AnimationSampler,_std::allocator<tinygltf::AnimationSampler>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->samplers).
  super__Vector_base<tinygltf::AnimationSampler,_std::allocator<tinygltf::AnimationSampler>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->samplers).
  super__Vector_base<tinygltf::AnimationSampler,_std::allocator<tinygltf::AnimationSampler>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Value::Value(&this->extras,&param_1->extras);
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->extensions)._M_t._M_impl.super__Rb_tree_header,
             &(param_1->extensions)._M_t._M_impl.super__Rb_tree_header);
  std::__cxx11::string::string
            ((string *)&this->extras_json_string,(string *)&param_1->extras_json_string);
  std::__cxx11::string::string
            ((string *)&this->extensions_json_string,(string *)&param_1->extensions_json_string);
  return;
}

Assistant:

Animation() = default;